

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

bool __thiscall chrono::ChOptimizerGenetic::DoOptimize(ChOptimizerGenetic *this)

{
  double dVar1;
  undefined4 uVar2;
  ChGenotype **ppCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  ChLog *pCVar7;
  long lVar8;
  void *__src;
  ChOptimizerGenetic *this_00;
  int i;
  long lVar9;
  ChGenotype *pCVar10;
  ulong uVar11;
  ChGenotype *pCVar12;
  ChGenotype *pCVar13;
  char *__format;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double mworstfitness;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  
  pCVar7 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar7->super_ChStreamOutAscii,"\n\n\nGENETIC OPTIMIZATION STARTED.............\n\n");
  uVar6 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])(this);
  CreatePopulation(this,&this->population,*(int *)&(this->super_ChOptimizer).field_0x144);
  InitializePopulation(this);
  this->mutants = 0;
  pCVar7 = GetLog();
  uVar2 = *(undefined4 *)&(pCVar7->super_ChStreamOutAscii).field_0x1c;
  pCVar7 = GetLog();
  *(undefined4 *)&(pCVar7->super_ChStreamOutAscii).field_0x1c = 4;
  ComputeAllFitness(this);
  this->generations_done = 1;
  if (0 < this->max_generations) {
    auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar24 = ZEXT1664(ZEXT816(0x412e847e00000000));
    lVar8 = 1;
    while( true ) {
      if ((this->crossv_change == DATE) && (this->crossv_changewhen < lVar8)) {
        this->crossover = this->crossv_changeto;
      }
      lVar8 = (long)*(int *)&(this->super_ChOptimizer).field_0x144;
      pCVar12 = *this->population;
      if (0 < lVar8) {
        auVar18 = ZEXT864((ulong)pCVar12->fitness);
        lVar9 = 0;
        do {
          pCVar13 = this->population[lVar9];
          dVar1 = pCVar13->fitness;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar1;
          auVar22 = vandpd_avx(auVar19,auVar23._0_16_);
          uVar4 = vcmppd_avx512vl(auVar22,auVar24._0_16_,4);
          uVar5 = vcmppd_avx512vl(auVar18._0_16_,auVar19,1);
          bVar14 = (bool)((byte)uVar4 & 3 & (byte)uVar5 & 1);
          if (bVar14 != false) {
            pCVar12 = pCVar13;
          }
          lVar9 = lVar9 + 1;
          auVar18 = ZEXT1664(CONCAT88(auVar18._8_8_,
                                      (ulong)bVar14 * (long)dVar1 + (ulong)!bVar14 * auVar18._0_8_))
          ;
        } while (lVar8 != lVar9);
      }
      ChGenotype::Copy(this->best_indiv,pCVar12);
      (this->super_ChOptimizer).opt_fx = this->best_indiv->fitness;
      PopulationStats(this,&this->average,&this->max_fitness,&this->min_fitness,&this->stdeviation);
      LogOut(this,true);
      if ((this->stop_by_stdeviation == true) && (this->stdeviation <= this->stop_stdeviation))
      break;
      if ((this->stop_by_fitness == true) && (this->stop_fitness <= this->max_fitness)) {
        lVar8 = this->generations_done;
        __format = "OK, imposed max fitness reached in %ld generations";
        goto LAB_007ced4e;
      }
      if ((this->super_ChOptimizer).user_break != 0) {
        if ((this->super_ChOptimizer).err_message[0] == '\0') {
          builtin_strncpy((this->super_ChOptimizer).err_message,"OK, user break",0xf);
        }
        goto LAB_007ced55;
      }
      Crossover(this);
      Mutation(this);
      ComputeAllFitness(this);
      Selection(this);
      auVar22._8_8_ = 0x7fffffffffffffff;
      auVar22._0_8_ = 0x7fffffffffffffff;
      auVar23 = ZEXT1664(auVar22);
      auVar19 = ZEXT816(0x412e847e00000000);
      auVar24 = ZEXT1664(auVar19);
      if (this->elite == true) {
        ppCVar3 = this->population;
        lVar8 = (long)*(int *)&(this->super_ChOptimizer).field_0x144;
        pCVar12 = *ppCVar3;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = pCVar12->fitness;
        if (lVar8 < 1) {
          pCVar13 = this->best_indiv;
          if (pCVar12->fitness < pCVar13->fitness) goto LAB_007cecc8;
        }
        else {
          lVar9 = 0;
          pCVar10 = pCVar12;
          auVar16 = auVar17;
          do {
            dVar1 = ppCVar3[lVar9]->fitness;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = dVar1;
            auVar15 = vandpd_avx(auVar21,auVar22);
            uVar4 = vcmppd_avx512vl(auVar15,auVar19,4);
            uVar5 = vcmppd_avx512vl(auVar16,auVar21,1);
            bVar14 = (bool)((byte)uVar4 & 3 & (byte)uVar5 & 1);
            if (bVar14 != false) {
              pCVar10 = ppCVar3[lVar9];
            }
            lVar9 = lVar9 + 1;
            auVar15._0_8_ = (ulong)bVar14 * (long)dVar1 + (ulong)!bVar14 * auVar16._0_8_;
            auVar15._8_8_ = auVar16._8_8_;
            auVar16 = auVar15;
          } while (lVar8 != lVar9);
          pCVar13 = this->best_indiv;
          if (pCVar10->fitness < pCVar13->fitness) {
            lVar9 = 0;
            do {
              dVar1 = ppCVar3[lVar9]->fitness;
              auVar20._8_8_ = 0;
              auVar20._0_8_ = dVar1;
              auVar16 = vandpd_avx(auVar20,auVar22);
              uVar4 = vcmppd_avx512vl(auVar16,auVar19,4);
              uVar5 = vcmppd_avx512vl(auVar20,auVar17,1);
              bVar14 = (bool)((byte)uVar4 & 3 & (byte)uVar5 & 1);
              if (bVar14 != false) {
                pCVar12 = ppCVar3[lVar9];
              }
              lVar9 = lVar9 + 1;
              auVar16._0_8_ = (ulong)bVar14 * (long)dVar1 + (ulong)!bVar14 * auVar17._0_8_;
              auVar16._8_8_ = auVar17._8_8_;
              auVar17 = auVar16;
            } while (lVar8 != lVar9);
LAB_007cecc8:
            ChGenotype::Copy(pCVar12,pCVar13);
            auVar24 = ZEXT1664(ZEXT816(0x412e847e00000000));
            auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
          }
        }
      }
      lVar9 = this->generations_done;
      lVar8 = lVar9 + 1;
      this->generations_done = lVar8;
      if (this->max_generations <= lVar9) goto LAB_007ced55;
    }
    lVar8 = this->generations_done;
    __format = "OK, imposed standard deviation reached in %ld generations";
LAB_007ced4e:
    sprintf((this->super_ChOptimizer).err_message,__format,lVar8);
  }
LAB_007ced55:
  pCVar7 = GetLog();
  *(undefined4 *)&(pCVar7->super_ChStreamOutAscii).field_0x1c = uVar2;
  if ((long)this->max_generations <= this->generations_done) {
    sprintf((this->super_ChOptimizer).err_message,"OK, all %d generations done");
  }
  pCVar7 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar7->super_ChStreamOutAscii,"\n\nGENETIC OPTIMIZATION TERMINATED.");
  pCVar7 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar7->super_ChStreamOutAscii,
             "\nResetting the system to the best genotype-variables found:");
  __src = calloc((long)(int)uVar6,8);
  if (0 < (int)uVar6) {
    uVar11 = 0;
    do {
      if ((this->best_indiv->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= (long)uVar11) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar1 = (this->best_indiv->genes).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar11];
      *(double *)((long)__src + uVar11 * 8) = dVar1;
      pCVar7 = GetLog();
      ChStreamOutAscii::operator<<(&pCVar7->super_ChStreamOutAscii,"\n   ");
      pCVar7 = GetLog();
      ChStreamOutAscii::operator<<(&pCVar7->super_ChStreamOutAscii,dVar1);
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  memcpy((this->super_ChOptimizer).xv,__src,(long)(int)uVar6 << 3);
  free(__src);
  pCVar7 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar7->super_ChStreamOutAscii,"\n with fitness (objective fx obtained) equal to = ");
  pCVar7 = GetLog();
  ChStreamOutAscii::operator<<(&pCVar7->super_ChStreamOutAscii,this->best_indiv->fitness);
  this_00 = (ChOptimizerGenetic *)GetLog();
  ChStreamOutAscii::operator<<((ChStreamOutAscii *)this_00,"\n\n\n");
  DeletePopulation(this_00,&this->population,*(int *)&(this->super_ChOptimizer).field_0x144);
  if ((this->super_ChOptimizer).C_vars == 0) {
    free((this->super_ChOptimizer).xv_sup);
    free((this->super_ChOptimizer).xv_inf);
  }
  return true;
}

Assistant:

bool ChOptimizerGenetic::DoOptimize() {
    GetLog() << "\n\n\nGENETIC OPTIMIZATION STARTED.............\n\n";

    int nv = GetNumOfVars();

    // allocate -if needed- the upper-lower boundaries arrays
    /*
        if (!C_vars)
        {
            xv_sup = (double*) calloc (nv, sizeof(double));
            xv_inf = (double*) calloc (nv, sizeof(double));
            int mvar = 0;

            for (ChOptVar* Vovar = optvarlist; Vovar != NULL; Vovar = (ChOptVar*) Vovar->GetNext())
            {
                xv_sup[mvar] = Vovar->GetLimSup();
                xv_inf[mvar] = Vovar->GetLimInf();
                mvar++;
            }
        }
    */

    CreatePopulation(population, popsize);
    InitializePopulation();

    mutants = 0;

    // avoid complete streaming of log during optimization;
    ChLog::eChLogLevel oldfilemode = GetLog().GetCurrentLevel();
    GetLog().SetCurrentLevel(ChLog::CHQUIET);

    // -- COMPUTE FITNESS  (for all individuals of brand-new population, 1st time)
    ComputeAllFitness();

    //
    // THE CYCLE OF OPTIMIZATION,
    // GENERATION BY GENERATION
    //
    for (generations_done = 1; generations_done <= max_generations; generations_done++) {
        if (crossv_change == CrossoverChangeType::DATE)
            if (generations_done > crossv_changewhen)
                crossover = crossv_changeto;

        // -- store the best individual of old population
        best_indiv->Copy(Select_best(population));

        // -- set the value of best found value of FX
        opt_fx = best_indiv->fitness;

        // -- statistics...
        PopulationStats(average, max_fitness, min_fitness, stdeviation);

        // -- log
        LogOut(true);

        // -- break cycle conditions
        if (stop_by_stdeviation)
            if (stdeviation <= stop_stdeviation) {
                sprintf(err_message, "OK, imposed standard deviation reached in %ld generations",
                        (long)generations_done);
                break;
            }
        if (stop_by_fitness)
            if (max_fitness >= stop_fitness) {
                sprintf(err_message, "OK, imposed max fitness reached in %ld generations", (long)generations_done);
                break;
            }

        // -- user break?
        if (user_break) {
            if (*err_message == 0)
                sprintf(err_message, "OK, user break");
            break;
        }

        // -- CROSSOVER
        Crossover();

        // -- MUTATION
        Mutation();

        // -- COMPUTE FITNESS
        ComputeAllFitness();

        // -- SELECTION
        Selection();

        if (elite) {
            if (Select_best(population)->fitness < best_indiv->fitness) {
                Select_worst(population)->Copy(best_indiv);
            }
        }
    }

    GetLog().SetCurrentLevel(oldfilemode);

    if (generations_done >= max_generations)
        sprintf(err_message, "OK, all %d generations done", max_generations);

    // on termination, reset the system at the value of the fenotypes of the best indiv.

    GetLog() << "\n\nGENETIC OPTIMIZATION TERMINATED.";

    GetLog() << "\nResetting the system to the best genotype-variables found:";

    // resetting system  (or xv[] vector) to best individual
    int mvar;
    double* myvars = (double*)calloc(nv, sizeof(double));
    for (mvar = 0; mvar < nv; mvar++) {
        myvars[mvar] = best_indiv->genes(mvar);
        GetLog() << "\n   ";
        GetLog() << myvars[mvar];
    }

    memcpy(xv, myvars, (sizeof(double) * nv));
    //	Vars_to_System(myvars);

    free(myvars);  // delete the array of variables

    GetLog() << "\n with fitness (objective fx obtained) equal to = ";
    GetLog() << best_indiv->fitness;
    GetLog() << "\n\n\n";

    // delete the population, useful anymore...
    DeletePopulation(population, popsize);

    if (!C_vars) {
        free(xv_sup);
        free(xv_inf);
    }

    return true;
}